

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcContextDependentUnit::IfcContextDependentUnit
          (IfcContextDependentUnit *this)

{
  *(undefined ***)&this->field_0x68 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcContextDependentUnit";
  IfcNamedUnit::IfcNamedUnit(&this->super_IfcNamedUnit,&PTR_construction_vtable_24__007a6960);
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x40 = 0;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x7a68f8;
  *(undefined8 *)&this->field_0x68 = 0x7a6948;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x7a6920;
  *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48 = &this->field_0x58;
  *(undefined8 *)&this->field_0x50 = 0;
  this->field_0x58 = 0;
  return;
}

Assistant:

IfcContextDependentUnit() : Object("IfcContextDependentUnit") {}